

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O0

QLayoutItem * __thiscall QDockAreaLayoutInfo::plug(QDockAreaLayoutInfo *this,QList<int> *path)

{
  long lVar1;
  int iVar2;
  int *piVar3;
  qsizetype qVar4;
  reference pQVar5;
  QDockAreaLayoutInfo *in_RSI;
  QList<int> *in_RDI;
  long in_FS_OFFSET;
  QDockAreaLayoutItem *item;
  QDockAreaLayoutItem *item_1;
  int index;
  qsizetype in_stack_ffffffffffffff98;
  QList<QDockAreaLayoutItem> *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffc0;
  QLayoutItem *local_28;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  piVar3 = QList<int>::first((QList<int> *)in_stack_ffffffffffffffa0);
  iVar2 = *piVar3;
  if (iVar2 < 0) {
    iVar2 = -1 - iVar2;
  }
  qVar4 = QList<int>::size((QList<int> *)in_RSI);
  if (qVar4 < 2) {
    pQVar5 = QList<QDockAreaLayoutItem>::operator[]
                       (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    pQVar5->flags = pQVar5->flags & 0xfffffffe;
    local_28 = pQVar5->widgetItem;
  }
  else {
    QList<QDockAreaLayoutItem>::operator[](in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    QList<int>::mid(in_RDI,(qsizetype)in_RSI,CONCAT44(iVar2,in_stack_ffffffffffffffc0));
    local_28 = plug(in_RSI,(QList<int> *)CONCAT44(iVar2,in_stack_ffffffffffffffc0));
    QList<int>::~QList((QList<int> *)0x570bcc);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_28;
  }
  __stack_chk_fail();
}

Assistant:

QLayoutItem *QDockAreaLayoutInfo::plug(const QList<int> &path)
{
    Q_ASSERT(!path.isEmpty());

    int index = path.first();
    if (index < 0)
        index = -index - 1;

    if (path.size() > 1) {
        QDockAreaLayoutItem &item = item_list[index];
        Q_ASSERT(item.subinfo != nullptr);
        return item.subinfo->plug(path.mid(1));
    }

    QDockAreaLayoutItem &item = item_list[index];

    Q_ASSERT(item.widgetItem != nullptr);
    Q_ASSERT(item.flags & QDockAreaLayoutItem::GapItem);
    item.flags &= ~QDockAreaLayoutItem::GapItem;
    return item.widgetItem;
}